

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitLoadFormalIntoRegister
          (ByteCodeGenerator *this,ParseNode *pnodeFormal,RegSlot pos,FuncInfo *funcInfo)

{
  RegSlot rhsLocation;
  ParseNodeVar *pPVar1;
  
  if ((byte)(pnodeFormal->nop + ~knopList) < 3) {
    pPVar1 = ParseNode::AsParseNodeVar(pnodeFormal);
    rhsLocation = pPVar1->sym->location;
    if (rhsLocation + 1 == pos) {
      EmitLocalPropInit(this,rhsLocation,pPVar1->sym,funcInfo);
      return;
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitLoadFormalIntoRegister(ParseNode *pnodeFormal, Js::RegSlot pos, FuncInfo *funcInfo)
{
    if (pnodeFormal->IsVarLetOrConst())
    {
        // Get the param from its argument position into its assigned register.
        // The position should match the location, otherwise, it has been shadowed by parameter with the same name
        Symbol *formal = pnodeFormal->AsParseNodeVar()->sym;
        if (formal->GetLocation() + 1 == pos)
        {
            // Transfer to the frame object, etc., if necessary.
            this->EmitLocalPropInit(formal->GetLocation(), formal, funcInfo);
        }
    }
}